

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,string *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  pointer *pppTVar1;
  pointer ppTVar2;
  size_t __n;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  int iVar4;
  iterator iVar5;
  TestSuite *pTVar6;
  undefined1 local_b0 [8];
  UnitTestFilter death_test_suite_filter;
  string local_58;
  TestSuite *local_38;
  TestSuite *new_test_suite;
  
  ppTVar2 = (this->test_suites_).
            super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket = (__node_base_ptr)set_up_tc;
  if ((this->test_suites_).
      super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
      super__Vector_impl_data._M_start != ppTVar2) {
    pTVar6 = ppTVar2[-1];
    __n = (pTVar6->name_)._M_string_length;
    if (__n == test_suite_name->_M_string_length) {
      if (__n == 0) {
        return pTVar6;
      }
      iVar4 = bcmp((pTVar6->name_)._M_dataplus._M_p,(test_suite_name->_M_dataplus)._M_p,__n);
      if (iVar4 == 0) {
        return pTVar6;
      }
    }
  }
  iVar5 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->test_suites_by_name_)._M_h,test_suite_name);
  if (iVar5.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
      ._M_cur == (__node_type *)0x0) {
    pTVar6 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite
              (pTVar6,test_suite_name,type_param,
               (SetUpTestSuiteFunc)
               death_test_suite_filter.exact_match_patterns_._M_h._M_single_bucket,tear_down_tc);
    local_38 = pTVar6;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::TestSuite*>,std::allocator<std::pair<std::__cxx11::string_const,testing::TestSuite*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string_const&,testing::TestSuite*const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,testing::TestSuite*>,std::allocator<std::pair<std::__cxx11::string_const,testing::TestSuite*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->test_suites_by_name_,test_suite_name);
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"*DeathTest:*DeathTest/*","");
    anon_unknown_28::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_b0,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    bVar3 = anon_unknown_28::UnitTestFilter::MatchesName((UnitTestFilter *)local_b0,test_suite_name)
    ;
    if (bVar3) {
      iVar4 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar4 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                (&this->test_suites_,
                 (const_iterator)
                 ((this->test_suites_).
                  super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)iVar4 + 1),&local_38);
    }
    else {
      __position._M_current =
           (this->test_suites_).
           super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_suites_).
          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>::
        _M_realloc_insert<testing::TestSuite*const&>
                  ((vector<testing::TestSuite*,std::allocator<testing::TestSuite*>> *)
                   &this->test_suites_,__position,&local_38);
      }
      else {
        *__position._M_current = local_38;
        pppTVar1 = &(this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
    }
    __position_00._M_current =
         (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar4 = (int)((ulong)((long)__position_00._M_current -
                         (long)(this->test_suite_indices_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    local_58._M_dataplus._M_p._0_4_ = iVar4;
    if (__position_00._M_current ==
        (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->test_suite_indices_,__position_00,(int *)&local_58);
    }
    else {
      *__position_00._M_current = iVar4;
      (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
    pTVar6 = local_38;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&death_test_suite_filter.glob_patterns_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_b0);
  }
  else {
    pTVar6 = *(TestSuite **)
              ((long)iVar5.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::TestSuite_*>,_true>
                     ._M_cur + 0x28);
  }
  return pTVar6;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const std::string& test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // During initialization, all TestInfos for a given suite are added in
  // sequence. To optimize this case, see if the most recently added suite is
  // the one being requested now.
  if (!test_suites_.empty() &&
      (*test_suites_.rbegin())->name_ == test_suite_name) {
    return *test_suites_.rbegin();
  }

  // Fall back to searching the collection.
  auto item_it = test_suites_by_name_.find(test_suite_name);
  if (item_it != test_suites_by_name_.end()) {
    return item_it->second;
  }

  // Not found. Create a new instance.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);
  test_suites_by_name_.emplace(test_suite_name, new_test_suite);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}